

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O1

void __thiscall amrex::MLLinOp::MLLinOp(MLLinOp *this)

{
  this->_vptr_MLLinOp = (_func_int **)&PTR__MLLinOp_00751408;
  (this->info).do_agglomeration = true;
  (this->info).do_consolidation = true;
  (this->info).do_semicoarsening = false;
  (this->info).agg_grid_size = -1;
  (this->info).con_grid_size = -1;
  (this->info).has_metric_term = true;
  (this->info).max_coarsening_level = 0x1e;
  (this->info).max_semicoarsening_level = 0;
  (this->info).semicoarsening_direction = -1;
  (this->info).hidden_direction = -1;
  this->verbose = 0;
  this->maxorder = 3;
  this->enforceSingularSolvable = true;
  (this->m_amr_ref_ratio).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->m_amr_ref_ratio).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->m_amr_ref_ratio).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  (this->m_num_mg_levels).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->m_num_mg_levels).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->m_num_mg_levels).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  this->m_parent = (MLLinOp *)0x0;
  (this->m_ixtype).vect[0] = 0;
  (this->m_ixtype).vect[1] = 0;
  *(undefined8 *)((long)(this->m_ixtype).vect + 7) = 0;
  memset(&this->mg_coarsen_ratio_vec,0,0x130);
  this->m_coarse_data_crse_ratio = -1;
  (this->m_coarse_bc_loc).vect[0] = 0.0;
  (this->m_coarse_bc_loc).vect[1] = 0.0;
  (this->m_coarse_bc_loc).vect[2] = 0.0;
  this->m_coarse_data_for_bc = (MultiFab *)0x0;
  return;
}

Assistant:

MLLinOp::MLLinOp () {}